

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QString,_QMakeLocalFileName>::emplaceValue<QMakeLocalFileName>
          (Node<QString,_QMakeLocalFileName> *this,QMakeLocalFileName *args)

{
  QMakeLocalFileName *in_RDI;
  long in_FS_OFFSET;
  QMakeLocalFileName *this_00;
  QMakeLocalFileName local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_38;
  QMakeLocalFileName::QMakeLocalFileName(this_00,in_RDI);
  QMakeLocalFileName::operator=(this_00,in_RDI);
  QMakeLocalFileName::~QMakeLocalFileName(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }